

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O2

void __thiscall TimeTest_LocalTime_Test::TestBody(TimeTest_LocalTime_Test *this)

{
  tm *ptVar1;
  char *in_R9;
  AssertHelper AStack_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertionResult gtest_ar_;
  time_t t;
  tm local_80;
  tm tm;
  
  t = time((time_t *)0x0);
  ptVar1 = localtime(&t);
  tm.tm_sec = ptVar1->tm_sec;
  tm.tm_min = ptVar1->tm_min;
  tm.tm_hour = ptVar1->tm_hour;
  tm.tm_mday = ptVar1->tm_mday;
  tm.tm_mon = ptVar1->tm_mon;
  tm.tm_year = ptVar1->tm_year;
  tm.tm_wday = ptVar1->tm_wday;
  tm.tm_yday = ptVar1->tm_yday;
  tm.tm_isdst = ptVar1->tm_isdst;
  tm._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  tm.tm_gmtoff = ptVar1->tm_gmtoff;
  tm.tm_zone = ptVar1->tm_zone;
  fmt::v5::localtime((v5 *)&local_80,(time_t *)t);
  gtest_ar_.success_ = EqualTime(&tm,&local_80);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_80,(internal *)&gtest_ar_,
               (AssertionResult *)"EqualTime(tm, fmt::localtime(t))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/time-test.cc"
               ,0x3d,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(TimeTest, LocalTime) {
  std::time_t t = std::time(FMT_NULL);
  std::tm tm = *std::localtime(&t);
  EXPECT_TRUE(EqualTime(tm, fmt::localtime(t)));
}